

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v10::detail::format_dragon
               (basic_fp<unsigned___int128> value,uint flags,int num_digits,buffer<char> *buf,
               int *exp10)

{
  undefined1 n [16];
  undefined1 value_00 [16];
  undefined1 n_00 [16];
  char cVar1;
  int iVar2;
  type tVar3;
  char *pcVar4;
  bool bVar5;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  undefined8 in_stack_fffffffffffffbf0;
  char local_375;
  int local_374;
  undefined4 local_370;
  int i_1;
  int overflow;
  int result;
  int digit;
  int digit_3;
  int i;
  int iStack_354;
  char digit_2;
  undefined1 local_34e;
  byte local_34d;
  int result_1;
  bool high;
  bool low;
  char *pcStack_348;
  int digit_1;
  char *data;
  bool shortest;
  undefined8 uStack_338;
  int even;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  int local_300;
  byte local_2f9;
  int shift;
  bool is_predecessor_closer;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  undefined1 local_180 [8];
  bigint denominator;
  bigint numerator;
  int *exp10_local;
  buffer<char> *buf_local;
  int num_digits_local;
  uint flags_local;
  
  buf_local._0_4_ = num_digits;
  buf_local._4_4_ = flags;
  bigint::bigint((bigint *)&denominator.exp_);
  bigint::bigint((bigint *)local_180);
  bigint::bigint((bigint *)&upper_store.exp_);
  bigint::bigint((bigint *)&upper);
  _shift = (bigint *)0x0;
  local_2f9 = (buf_local._4_4_ & 1) != 0;
  local_300 = 1;
  if ((bool)local_2f9) {
    local_300 = 2;
  }
  if (value.e < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10((bigint *)&denominator.exp_,-*exp10);
      bigint::assign((bigint *)&upper_store.exp_,(bigint *)&denominator.exp_);
      if ((local_2f9 & 1) != 0) {
        bigint::assign((bigint *)&upper,(bigint *)&denominator.exp_);
        bigint::operator<<=((bigint *)&upper,1);
        _shift = (bigint *)&upper;
      }
      local_328 = (undefined8)value.f;
      local_320 = value.f._8_8_;
      value_00[7] = in_stack_fffffffffffffbef;
      value_00._0_7_ = in_stack_fffffffffffffbe8;
      value_00._8_8_ = in_stack_fffffffffffffbf0;
      bigint::operator*=((bigint *)&denominator.exp_,(unsigned___int128)value_00);
      bigint::operator<<=((bigint *)&denominator.exp_,local_300);
      bigint::operator=((bigint *)local_180,1);
      bigint::operator<<=((bigint *)local_180,local_300 - value.e);
    }
    else {
      uStack_338 = (undefined8)value.f;
      local_330 = value.f._8_8_;
      n_00[7] = in_stack_fffffffffffffbef;
      n_00._0_7_ = in_stack_fffffffffffffbe8;
      n_00._8_8_ = in_stack_fffffffffffffbf0;
      bigint::operator=((bigint *)&denominator.exp_,(unsigned___int128)n_00);
      bigint::operator<<=((bigint *)&denominator.exp_,local_300);
      bigint::assign_pow10((bigint *)local_180,*exp10);
      bigint::operator<<=((bigint *)local_180,local_300 - value.e);
      bigint::operator=((bigint *)&upper_store.exp_,1);
      if ((local_2f9 & 1) != 0) {
        bigint::operator=((bigint *)&upper,2);
        _shift = (bigint *)&upper;
      }
    }
  }
  else {
    local_318 = (undefined8)value.f;
    local_310 = value.f._8_8_;
    n[7] = in_stack_fffffffffffffbef;
    n._0_7_ = in_stack_fffffffffffffbe8;
    n._8_8_ = in_stack_fffffffffffffbf0;
    bigint::operator=((bigint *)&denominator.exp_,(unsigned___int128)n);
    bigint::operator<<=((bigint *)&denominator.exp_,value.e + local_300);
    bigint::operator=((bigint *)&upper_store.exp_,1);
    bigint::operator<<=((bigint *)&upper_store.exp_,value.e);
    if ((local_2f9 & 1) != 0) {
      bigint::operator=((bigint *)&upper,1);
      bigint::operator<<=((bigint *)&upper,value.e + 1);
      _shift = (bigint *)&upper;
    }
    bigint::assign_pow10((bigint *)local_180,*exp10);
    bigint::operator<<=((bigint *)local_180,local_300);
  }
  data._4_4_ = (uint)(((undefined1  [32])value & (undefined1  [32])0x1) == (undefined1  [32])0x0);
  if (_shift == (bigint *)0x0) {
    _shift = (bigint *)&upper_store.exp_;
  }
  data._3_1_ = (int)buf_local < 0;
  if ((buf_local._4_4_ & 2) != 0) {
    iVar2 = add_compare((bigint *)&denominator.exp_,_shift,(bigint *)local_180);
    if ((int)(iVar2 + data._4_4_) < 1) {
      *exp10 = *exp10 + -1;
      bigint::operator*=((bigint *)&denominator.exp_,10);
      if (((int)buf_local < 0) &&
         (bigint::operator*=((bigint *)&upper_store.exp_,10), _shift != (bigint *)&upper_store.exp_)
         ) {
        bigint::operator*=(_shift,10);
      }
    }
    if ((buf_local._4_4_ & 4) != 0) {
      adjust_precision((int *)&buf_local,*exp10 + 1);
    }
  }
  if ((data._3_1_ & 1) == 0) {
    *exp10 = *exp10 - ((int)buf_local + -1);
    if ((int)buf_local < 1) {
      bigint::operator*=((bigint *)local_180,10);
      iVar2 = add_compare((bigint *)&denominator.exp_,(bigint *)&denominator.exp_,
                          (bigint *)local_180);
      digit_3._3_1_ = 0 < iVar2 | 0x30;
      buffer<char>::push_back(buf,(char *)((long)&digit_3 + 3));
      i = 1;
    }
    else {
      tVar3 = to_unsigned<int>((int)buf_local);
      buffer<char>::try_resize(buf,(ulong)tVar3);
      for (digit = 0; digit < (int)buf_local + -1; digit = digit + 1) {
        result = bigint::divmod_assign((bigint *)&denominator.exp_,(bigint *)local_180);
        cVar1 = (char)result + '0';
        pcVar4 = buffer<char>::operator[]<int>(buf,digit);
        *pcVar4 = cVar1;
        bigint::operator*=((bigint *)&denominator.exp_,10);
      }
      overflow = bigint::divmod_assign((bigint *)&denominator.exp_,(bigint *)local_180);
      i_1 = add_compare((bigint *)&denominator.exp_,(bigint *)&denominator.exp_,(bigint *)local_180)
      ;
      if ((0 < i_1) || ((i_1 == 0 && (overflow % 2 != 0)))) {
        if (overflow == 9) {
          local_370 = 0x3a;
          pcVar4 = buffer<char>::operator[]<int>(buf,(int)buf_local + -1);
          *pcVar4 = ':';
          local_374 = (int)buf_local;
          while( true ) {
            local_374 = local_374 + -1;
            bVar5 = false;
            if (0 < local_374) {
              pcVar4 = buffer<char>::operator[]<int>(buf,local_374);
              bVar5 = *pcVar4 == ':';
            }
            if (!bVar5) break;
            pcVar4 = buffer<char>::operator[]<int>(buf,local_374);
            *pcVar4 = '0';
            pcVar4 = buffer<char>::operator[]<int>(buf,local_374 + -1);
            *pcVar4 = *pcVar4 + '\x01';
          }
          pcVar4 = buffer<char>::operator[]<int>(buf,0);
          if (*pcVar4 == ':') {
            pcVar4 = buffer<char>::operator[]<int>(buf,0);
            *pcVar4 = '1';
            if ((buf_local._4_4_ & 4) == 0) {
              *exp10 = *exp10 + 1;
            }
            else {
              local_375 = '0';
              buffer<char>::push_back(buf,&local_375);
            }
          }
          i = 1;
          goto LAB_003def34;
        }
        overflow = overflow + 1;
      }
      cVar1 = (char)overflow + '0';
      pcVar4 = buffer<char>::operator[]<int>(buf,(int)buf_local + -1);
      *pcVar4 = cVar1;
      i = 0;
    }
  }
  else {
    buf_local._0_4_ = 0;
    pcStack_348 = buffer<char>::data(buf);
    while( true ) {
      result_1 = bigint::divmod_assign((bigint *)&denominator.exp_,(bigint *)local_180);
      iVar2 = compare((bigint *)&denominator.exp_,(bigint *)&upper_store.exp_);
      local_34d = (byte)(iVar2 - data._4_4_ >> 0x1f);
      iVar2 = add_compare((bigint *)&denominator.exp_,_shift,(bigint *)local_180);
      local_34e = 0 < (int)(iVar2 + data._4_4_);
      iVar2 = (int)buf_local + 1;
      pcStack_348[(int)buf_local] = (char)result_1 + '0';
      if (((local_34d & 1) != 0) || ((bool)local_34e)) break;
      buf_local._0_4_ = iVar2;
      bigint::operator*=((bigint *)&denominator.exp_,10);
      bigint::operator*=((bigint *)&upper_store.exp_,10);
      if (_shift != (bigint *)&upper_store.exp_) {
        bigint::operator*=(_shift,10);
      }
    }
    if ((local_34d & 1) == 0) {
      pcStack_348[(int)buf_local] = pcStack_348[(int)buf_local] + '\x01';
      buf_local._0_4_ = iVar2;
    }
    else {
      buf_local._0_4_ = iVar2;
      if (((bool)local_34e) &&
         ((iStack_354 = add_compare((bigint *)&denominator.exp_,(bigint *)&denominator.exp_,
                                    (bigint *)local_180), 0 < iStack_354 ||
          ((iStack_354 == 0 && (result_1 % 2 != 0)))))) {
        pcStack_348[(int)buf_local + -1] = pcStack_348[(int)buf_local + -1] + '\x01';
      }
    }
    tVar3 = to_unsigned<int>((int)buf_local);
    buffer<char>::try_resize(buf,(ulong)tVar3);
    *exp10 = *exp10 - ((int)buf_local + -1);
    i = 1;
  }
LAB_003def34:
  bigint::~bigint((bigint *)&upper);
  bigint::~bigint((bigint *)&upper_store.exp_);
  bigint::~bigint((bigint *)local_180);
  bigint::~bigint((bigint *)&denominator.exp_);
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(basic_fp<uint128_t> value,
                                          unsigned flags, int num_digits,
                                          buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  bool is_predecessor_closer = (flags & dragon::predecessor_closer) != 0;
  int shift = is_predecessor_closer ? 2 : 1;
  if (value.e >= 0) {
    numerator = value.f;
    numerator <<= value.e + shift;
    lower = 1;
    lower <<= value.e;
    if (is_predecessor_closer) {
      upper_store = 1;
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (is_predecessor_closer) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= value.f;
    numerator <<= shift;
    denominator = 1;
    denominator <<= shift - value.e;
  } else {
    numerator = value.f;
    numerator <<= shift;
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower = 1;
    if (is_predecessor_closer) {
      upper_store = 1ULL << 1;
      upper = &upper_store;
    }
  }
  int even = static_cast<int>((value.f & 1) == 0);
  if (!upper) upper = &lower;
  bool shortest = num_digits < 0;
  if ((flags & dragon::fixup) != 0) {
    if (add_compare(numerator, *upper, denominator) + even <= 0) {
      --exp10;
      numerator *= 10;
      if (num_digits < 0) {
        lower *= 10;
        if (upper != &lower) *upper *= 10;
      }
    }
    if ((flags & dragon::fixed) != 0) adjust_precision(num_digits, exp10 + 1);
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (shortest) {
    // Generate the shortest representation.
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits <= 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        if ((flags & dragon::fixed) != 0)
          buf.push_back('0');
        else
          ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}